

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O3

int __thiscall ncnn::Unfold::forward(Unfold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  undefined4 *puVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  Option opt_b;
  long local_110;
  Mat local_c8;
  Option local_78;
  
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_ops = opt->use_subgroup_ops;
  local_78.use_reserved_0 = opt->use_reserved_0;
  local_78.num_threads = opt->num_threads;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar18._0_1_ = opt->use_bf16_storage;
  uVar18._1_1_ = opt->use_fp16_packed;
  uVar18._2_1_ = opt->use_fp16_storage;
  uVar18._3_1_ = opt->use_fp16_arithmetic;
  uVar18._4_1_ = opt->use_int8_packed;
  uVar18._5_1_ = opt->use_int8_storage;
  uVar18._6_1_ = opt->use_int8_arithmetic;
  uVar18._7_1_ = opt->use_packing_layout;
  local_78.vulkan_device_index = opt->vulkan_device_index;
  local_78.use_reserved_1 = opt->use_reserved_1;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_reserved_2 = opt->use_reserved_2;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_shader_local_memory = opt->use_shader_local_memory;
  local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
  local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
  local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
  local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
  local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  local_78.use_fp16_uniform = opt->use_fp16_uniform;
  local_78.use_int8_uniform = opt->use_int8_uniform;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78.blob_allocator = opt->workspace_allocator;
  local_78._32_8_ = uVar18 & 0xffffffffffffff;
  make_padding(this,bottom_blob,&local_c8,&local_78);
  iVar13 = local_c8.w;
  if (local_c8.data != (void *)0x0) {
    iVar1 = local_c8.c;
    lVar21 = (long)local_c8.c;
    if (local_c8.cstep * lVar21 != 0) {
      iVar10 = (~((this->kernel_w + -1) * this->dilation_w) + local_c8.w) / this->stride_w;
      iVar11 = (~((this->kernel_h + -1) * this->dilation_h) + local_c8.h) / this->stride_h;
      iVar15 = iVar10 + 1;
      iVar17 = this->kernel_h * this->kernel_w;
      Mat::create(top_blob,(iVar11 + 1) * iVar15,iVar17 * local_c8.c,
                  CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                  opt->blob_allocator);
      pvVar8 = top_blob->data;
      iVar23 = -100;
      if ((pvVar8 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (0 < iVar1) {
          iVar1 = this->stride_h;
          iVar23 = this->stride_w;
          iVar2 = top_blob->w;
          sVar9 = top_blob->elemsize;
          uVar3 = this->kernel_w;
          uVar4 = this->kernel_h;
          local_110 = 0;
          do {
            if (0 < (int)uVar4) {
              puVar19 = (undefined4 *)
                        (local_110 * (long)iVar17 * (long)iVar2 * sVar9 + (long)pvVar8);
              iVar5 = this->dilation_h;
              iVar6 = this->dilation_w;
              uVar18 = 0;
              do {
                if (0 < (int)uVar3) {
                  uVar16 = 0;
                  do {
                    if (-1 < iVar11) {
                      puVar14 = (undefined4 *)
                                ((long)local_c8.data +
                                uVar16 * (long)iVar6 * 4 +
                                uVar18 * (long)iVar5 *
                                         (long)local_c8.w *
                                         CONCAT44(local_c8.elemsize._4_4_,
                                                  (undefined4)local_c8.elemsize) +
                                local_c8.cstep *
                                CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                local_110);
                      iVar7 = this->stride_w;
                      iVar22 = 0;
                      do {
                        iVar20 = iVar15;
                        if (-1 < iVar10) {
                          do {
                            *puVar19 = *puVar14;
                            puVar19 = puVar19 + 1;
                            puVar14 = puVar14 + iVar7;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        puVar14 = puVar14 + (iVar13 * iVar1 - iVar23 * iVar15);
                        bVar24 = iVar22 != iVar11;
                        iVar22 = iVar22 + 1;
                      } while (bVar24);
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != uVar3);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar4);
            }
            local_110 = local_110 + 1;
          } while (local_110 != lVar21);
        }
        iVar23 = 0;
      }
      goto LAB_0058793a;
    }
  }
  iVar23 = -100;
LAB_0058793a:
  piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int Unfold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        opt_b.use_packing_layout = false;
        make_padding(bottom_blob, bottom_blob_bordered, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;
    }

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const int channels = bottom_blob_bordered.c;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    const int size = outw * outh;
    const int maxk = kernel_w * kernel_h;

    top_blob.create(size, maxk * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // im2col
    const int gap = w * stride_h - outw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const Mat img = bottom_blob_bordered.channel(p);
        float* ptr = top_blob.row(p * maxk);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                const float* sptr = img.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        ptr[0] = sptr[0];

                        sptr += stride_w;
                        ptr += 1;
                    }

                    sptr += gap;
                }
            }
        }
    }

    return 0;
}